

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5f811d::ConversionOperatorType::printLeft
          (ConversionOperatorType *this,OutputStream *S)

{
  Node *pNVar1;
  
  OutputStream::grow(S,9);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"operator ",9);
  S->CurrentPosition = S->CurrentPosition + 9;
  pNVar1 = this->Ty;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache == No) {
    return;
  }
  (*pNVar1->_vptr_Node[5])(pNVar1,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "operator ";
    Ty->print(S);
  }